

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.h
# Opt level: O3

void __thiscall
SGParser::Generator::NFA::NFA
          (NFA *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *c,uint lexemeId)

{
  this->LexemeId = 0xffffffff;
  this->pStartState = (NFANode *)0x0;
  (this->FinalState).
  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FinalState).
  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FinalState).
  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Create(this,c,lexemeId);
  return;
}

Assistant:

NFA(const std::vector<unsigned>& c, unsigned lexemeId) {
        Create(c, lexemeId);
    }